

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int DecodeImageData(VP8LDecoder *dec,uint32_t *data,int width,int height,int last_row,
                   ProcessRowsFunc process_func)

{
  VP8LBitReader *br;
  int *piVar1;
  VP8LColorCache *src;
  VP8LColorCache *dst;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint32_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  vp8l_val_t vVar8;
  uint8_t *puVar9;
  size_t sVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint32_t *puVar20;
  uint32_t *puVar21;
  HuffmanCode *pHVar22;
  VP8LColorCache *pVVar23;
  HTreeGroup *pHVar24;
  ulong uVar25;
  uint32_t uVar26;
  uint uVar27;
  int iVar28;
  uint32_t *puVar29;
  uint32_t *puVar30;
  bool bVar31;
  
  iVar28 = dec->last_pixel_;
  uVar6 = (long)iVar28 / (long)width;
  uVar7 = (long)iVar28 % (long)width;
  uVar19 = uVar7 & 0xffffffff;
  uVar14 = uVar6 & 0xffffffff;
  iVar4 = (dec->hdr_).color_cache_size_;
  uVar25 = 0x1000000;
  if (dec->incremental_ != 0) {
    uVar25 = uVar14;
  }
  src = &(dec->hdr_).color_cache_;
  pHVar24 = (HTreeGroup *)0x0;
  pVVar23 = (VP8LColorCache *)0x0;
  if (0 < iVar4) {
    pVVar23 = src;
  }
  if (iVar28 < last_row * width) {
    iVar16 = (dec->hdr_).huffman_subsample_bits_;
    if (iVar16 == 0) {
      lVar18 = 0;
    }
    else {
      bVar15 = (byte)iVar16;
      lVar18 = (long)(int)(dec->hdr_).huffman_image_
                          [((int)uVar7 >> (bVar15 & 0x1f)) +
                           ((int)uVar6 >> (bVar15 & 0x1f)) * (dec->hdr_).huffman_xsize_];
    }
    pHVar24 = (dec->hdr_).htree_groups_ + lVar18;
  }
  br = &dec->br_;
  puVar30 = data + iVar28;
  uVar13 = (dec->hdr_).huffman_mask_;
  dst = &(dec->hdr_).saved_color_cache_;
  puVar20 = puVar30;
  do {
    iVar28 = (int)uVar14;
    uVar27 = (uint)uVar19;
    puVar21 = puVar20;
    if (data + last_row * width <= puVar20) goto LAB_00113dde;
    if ((int)uVar25 <= iVar28) {
      iVar16 = (dec->br_).eos_;
      (dec->saved_br_).bit_pos_ = (dec->br_).bit_pos_;
      (dec->saved_br_).eos_ = iVar16;
      vVar8 = br->val_;
      puVar9 = (dec->br_).buf_;
      sVar10 = (dec->br_).pos_;
      (dec->saved_br_).len_ = (dec->br_).len_;
      (dec->saved_br_).pos_ = sVar10;
      (dec->saved_br_).val_ = vVar8;
      (dec->saved_br_).buf_ = puVar9;
      dec->saved_last_pixel_ = (int)((ulong)((long)puVar20 - (long)data) >> 2);
      if (0 < (dec->hdr_).color_cache_size_) {
        VP8LColorCacheCopy(src,dst);
      }
      uVar25 = (ulong)(iVar28 + 8);
    }
    if ((uVar13 & uVar27) == 0) {
      iVar16 = (dec->hdr_).huffman_subsample_bits_;
      if (iVar16 == 0) {
        lVar18 = 0;
      }
      else {
        bVar15 = (byte)iVar16;
        lVar18 = (long)(int)(dec->hdr_).huffman_image_
                            [((int)uVar27 >> (bVar15 & 0x1f)) +
                             (iVar28 >> (bVar15 & 0x1f)) * (dec->hdr_).huffman_xsize_];
      }
      pHVar24 = (dec->hdr_).htree_groups_ + lVar18;
    }
    if (pHVar24->is_trivial_code != 0) {
      uVar26 = pHVar24->literal_arb;
      goto LAB_001136f7;
    }
    if (0x1f < (dec->br_).bit_pos_) {
      VP8LDoFillBitWindow(br);
    }
    if (pHVar24->use_packed_table == 0) {
      uVar6 = (dec->br_).val_;
      iVar16 = (dec->br_).bit_pos_;
      pHVar22 = pHVar24->htrees[0] + (uVar6 >> ((byte)iVar16 & 0x3f) & 0xff);
      bVar15 = pHVar22->bits;
      if (8 < bVar15) {
        iVar16 = iVar16 + 8;
        (dec->br_).bit_pos_ = iVar16;
        pHVar22 = pHVar22 + (ulong)pHVar22->value +
                            (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                   (uint)(uVar6 >> ((byte)iVar16 & 0x3f)));
      }
      piVar1 = &(dec->br_).bit_pos_;
      *piVar1 = *piVar1 + (uint)pHVar22->bits;
      uVar26 = (uint32_t)pHVar22->value;
LAB_001138b7:
      iVar16 = 3;
      if (((dec->br_).eos_ == 0) &&
         (((dec->br_).pos_ != (dec->br_).len_ || ((dec->br_).bit_pos_ < 0x41)))) {
        if ((int)uVar26 < 0x100) {
          if (pHVar24->is_trivial_literal != 0) {
            uVar26 = uVar26 << 8 | pHVar24->literal_arb;
LAB_001136f7:
            *puVar20 = uVar26;
            goto LAB_001136fb;
          }
          uVar6 = (dec->br_).val_;
          iVar16 = (dec->br_).bit_pos_;
          pHVar22 = pHVar24->htrees[1] + (uVar6 >> ((byte)iVar16 & 0x3f) & 0xff);
          bVar15 = pHVar22->bits;
          if (8 < bVar15) {
            iVar16 = iVar16 + 8;
            (dec->br_).bit_pos_ = iVar16;
            pHVar22 = pHVar22 + (ulong)pHVar22->value +
                                (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                       (uint)(uVar6 >> ((byte)iVar16 & 0x3f)));
          }
          iVar16 = (uint)pHVar22->bits + (dec->br_).bit_pos_;
          (dec->br_).bit_pos_ = iVar16;
          uVar2 = pHVar22->value;
          if (0x1f < iVar16) {
            VP8LDoFillBitWindow(br);
          }
          uVar6 = (dec->br_).val_;
          iVar16 = (dec->br_).bit_pos_;
          pHVar22 = pHVar24->htrees[2] + (uVar6 >> ((byte)iVar16 & 0x3f) & 0xff);
          bVar15 = pHVar22->bits;
          if (8 < bVar15) {
            iVar16 = iVar16 + 8;
            (dec->br_).bit_pos_ = iVar16;
            pHVar22 = pHVar22 + (ulong)pHVar22->value +
                                (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                       (uint)(uVar6 >> ((byte)iVar16 & 0x3f)));
          }
          iVar16 = (uint)pHVar22->bits + (dec->br_).bit_pos_;
          (dec->br_).bit_pos_ = iVar16;
          uVar3 = pHVar22->value;
          pHVar22 = pHVar24->htrees[3] + (uVar6 >> ((byte)iVar16 & 0x3f) & 0xff);
          bVar15 = pHVar22->bits;
          if (8 < bVar15) {
            (dec->br_).bit_pos_ = iVar16 + 8;
            pHVar22 = pHVar22 + (ulong)pHVar22->value +
                                (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                       (uint)(uVar6 >> ((byte)(iVar16 + 8) & 0x3f)));
          }
          iVar16 = (uint)pHVar22->bits + (dec->br_).bit_pos_;
          (dec->br_).bit_pos_ = iVar16;
          if ((dec->br_).eos_ == 0) {
            bVar31 = iVar16 < 0x41 || (dec->br_).pos_ != (dec->br_).len_;
          }
          else {
            bVar31 = false;
          }
          iVar16 = 3;
          if (bVar31) {
            *puVar20 = uVar26 << 8 | (uint)uVar2 << 0x10 | (uint)uVar3 |
                       (uint)pHVar22->value << 0x18;
            goto LAB_001136fb;
          }
        }
        else if ((int)uVar26 < 0x118) {
          if ((int)uVar26 < 0x104) {
            iVar28 = uVar26 - 0x100;
          }
          else {
            uVar11 = uVar26 - 0x102 >> 1;
            uVar12 = VP8LReadBits(br,uVar11);
            iVar28 = uVar12 + ((uVar26 & 1 | 2) << ((byte)uVar11 & 0x1f));
          }
          uVar6 = (dec->br_).val_;
          iVar17 = (dec->br_).bit_pos_;
          pHVar22 = pHVar24->htrees[4] + (uVar6 >> ((byte)iVar17 & 0x3f) & 0xff);
          bVar15 = pHVar22->bits;
          if (8 < bVar15) {
            iVar17 = iVar17 + 8;
            (dec->br_).bit_pos_ = iVar17;
            pHVar22 = pHVar22 + (ulong)pHVar22->value +
                                (ulong)(~(-1 << (bVar15 - 8 & 0x1f)) &
                                       (uint)(uVar6 >> ((byte)iVar17 & 0x3f)));
          }
          iVar17 = (uint)pHVar22->bits + (dec->br_).bit_pos_;
          (dec->br_).bit_pos_ = iVar17;
          uVar2 = pHVar22->value;
          uVar11 = (uint)uVar2;
          if (0x1f < iVar17) {
            VP8LDoFillBitWindow(br);
          }
          if (3 < uVar2) {
            uVar11 = uVar2 - 2 >> 1;
            uVar26 = VP8LReadBits(br,uVar11);
            uVar11 = uVar26 + ((uVar2 & 1 | 2) << ((byte)uVar11 & 0x1f));
          }
          if ((int)(uVar11 + 1) < 0x79) {
            iVar17 = ((uint)("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                             [(int)uVar11] >> 4) * width -
                     ("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                      [(int)uVar11] & 0xf)) + 8;
            if (iVar17 < 2) {
              iVar17 = 1;
            }
          }
          else {
            iVar17 = uVar11 - 0x77;
          }
          if (((dec->br_).eos_ == 0) &&
             ((((dec->br_).pos_ != (dec->br_).len_ || ((dec->br_).bit_pos_ < 0x41)) &&
              (iVar16 = 7, (long)iVar17 <= (long)puVar20 - (long)data >> 2)))) {
            iVar28 = iVar28 + 1;
            if ((long)iVar28 <= (long)(data + height * width) - (long)puVar20 >> 2) {
              CopyBlock32b(puVar20,iVar17,iVar28);
              uVar27 = uVar27 + iVar28;
              while( true ) {
                uVar19 = (ulong)uVar27;
                iVar16 = (int)uVar14;
                if ((int)uVar27 < width) break;
                uVar11 = iVar16 + 1;
                uVar14 = (ulong)uVar11;
                if ((uVar11 & 0xf) == 0 &&
                    (iVar16 < last_row && process_func != (ProcessRowsFunc)0x0)) {
                  (*process_func)(dec,uVar11);
                }
                uVar27 = uVar27 - width;
              }
              if ((uVar13 & uVar27) != 0) {
                iVar17 = (dec->hdr_).huffman_subsample_bits_;
                if (iVar17 == 0) {
                  lVar18 = 0;
                }
                else {
                  bVar15 = (byte)iVar17;
                  lVar18 = (long)(int)(dec->hdr_).huffman_image_
                                      [((int)uVar27 >> (bVar15 & 0x1f)) +
                                       (iVar16 >> (bVar15 & 0x1f)) * (dec->hdr_).huffman_xsize_];
                }
                pHVar24 = (dec->hdr_).htree_groups_ + lVar18;
              }
              puVar21 = puVar20 + iVar28;
              iVar16 = 0;
              if ((0 < iVar4) && (iVar16 = 0, puVar30 < puVar21)) {
                puVar20 = pVVar23->colors_;
                do {
                  uVar26 = *puVar30;
                  puVar30 = puVar30 + 1;
                  puVar20[(int)(uVar26 * 0x1e35a7bd >> ((byte)pVVar23->hash_shift_ & 0x1f))] =
                       uVar26;
                } while (puVar30 < puVar21);
              }
            }
          }
        }
        else {
          iVar16 = 7;
          if ((int)uVar26 < iVar4 + 0x118) {
            if (puVar30 < puVar20) {
              puVar21 = pVVar23->colors_;
              do {
                uVar12 = *puVar30;
                puVar30 = puVar30 + 1;
                puVar21[(int)(uVar12 * 0x1e35a7bd >> ((byte)pVVar23->hash_shift_ & 0x1f))] = uVar12;
              } while (puVar30 < puVar20);
            }
            uVar26 = pVVar23->colors_[(ulong)uVar26 - 0x118];
            goto LAB_001136f7;
          }
        }
      }
    }
    else {
      iVar16 = (dec->br_).bit_pos_;
      uVar11 = (uint)((dec->br_).val_ >> ((byte)iVar16 & 0x3f)) & 0x3f;
      iVar17 = pHVar24->packed_table[uVar11].bits;
      uVar26 = pHVar24->packed_table[uVar11].value;
      iVar16 = iVar16 + iVar17;
      if (iVar17 < 0x100) {
        (dec->br_).bit_pos_ = iVar16;
        *puVar20 = uVar26;
        uVar26 = 0;
      }
      else {
        (dec->br_).bit_pos_ = iVar16 + -0x100;
      }
      iVar16 = 3;
      if (((dec->br_).eos_ == 0) &&
         (((dec->br_).pos_ != (dec->br_).len_ || ((dec->br_).bit_pos_ < 0x41)))) {
        if (uVar26 != 0) goto LAB_001138b7;
LAB_001136fb:
        puVar21 = puVar20 + 1;
        uVar19 = (ulong)(uVar27 + 1);
        iVar16 = 0;
        if (width <= (int)(uVar27 + 1)) {
          uVar27 = iVar28 + 1;
          if ((uVar27 & 0xf) == 0 && (iVar28 < last_row && process_func != (ProcessRowsFunc)0x0)) {
            (*process_func)(dec,uVar27);
          }
          iVar16 = 0;
          if ((iVar4 < 1) || (puVar21 <= puVar30)) {
            uVar19 = 0;
            uVar14 = (ulong)uVar27;
          }
          else {
            puVar5 = pVVar23->colors_;
            puVar29 = puVar30;
            do {
              puVar30 = puVar29 + 1;
              puVar5[(int)(*puVar29 * 0x1e35a7bd >> ((byte)pVVar23->hash_shift_ & 0x1f))] = *puVar29
              ;
              bVar31 = puVar29 < puVar20;
              puVar29 = puVar30;
            } while (bVar31);
            uVar19 = 0;
            uVar14 = (ulong)uVar27;
          }
        }
      }
    }
    iVar28 = (int)uVar14;
    puVar20 = puVar21;
  } while (iVar16 == 0);
  if (iVar16 != 7) {
    if (iVar16 != 3) goto LAB_00113ea6;
LAB_00113dde:
    uVar13 = 1;
    if (((dec->br_).eos_ == 0) && (uVar13 = 0, (dec->br_).pos_ == (dec->br_).len_)) {
      uVar13 = (uint)(0x40 < (dec->br_).bit_pos_);
    }
    (dec->br_).eos_ = uVar13;
    if (((dec->incremental_ != 0) && (uVar13 != 0)) && (puVar21 < data + height * width)) {
      dec->status_ = VP8_STATUS_SUSPENDED;
      iVar28 = (dec->saved_br_).eos_;
      (dec->br_).bit_pos_ = (dec->saved_br_).bit_pos_;
      (dec->br_).eos_ = iVar28;
      vVar8 = (dec->saved_br_).val_;
      puVar9 = (dec->saved_br_).buf_;
      sVar10 = (dec->saved_br_).pos_;
      (dec->br_).len_ = (dec->saved_br_).len_;
      (dec->br_).pos_ = sVar10;
      br->val_ = vVar8;
      (dec->br_).buf_ = puVar9;
      dec->last_pixel_ = dec->saved_last_pixel_;
      puVar21 = (uint32_t *)0x1;
      if (0 < (dec->hdr_).color_cache_size_) {
        VP8LColorCacheCopy(dst,src);
      }
      goto LAB_00113ea6;
    }
    if (uVar13 == 0) {
      if (process_func != (ProcessRowsFunc)0x0) {
        if (iVar28 < last_row) {
          last_row = iVar28;
        }
        (*process_func)(dec,last_row);
      }
      dec->status_ = VP8_STATUS_OK;
      dec->last_pixel_ = (int)((ulong)((long)puVar21 - (long)data) >> 2);
      puVar21 = (uint32_t *)0x1;
      goto LAB_00113ea6;
    }
  }
  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  puVar21 = (uint32_t *)0x0;
LAB_00113ea6:
  return (int)puVar21;
}

Assistant:

static int DecodeImageData(VP8LDecoder* const dec, uint32_t* const data,
                           int width, int height, int last_row,
                           ProcessRowsFunc process_func) {
  int row = dec->last_pixel_ / width;
  int col = dec->last_pixel_ % width;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* src = data + dec->last_pixel_;
  uint32_t* last_cached = src;
  uint32_t* const src_end = data + width * height;     // End of data
  uint32_t* const src_last = data + width * last_row;  // Last pixel to decode
  const int len_code_limit = NUM_LITERAL_CODES + NUM_LENGTH_CODES;
  const int color_cache_limit = len_code_limit + hdr->color_cache_size_;
  int next_sync_row = dec->incremental_ ? row : 1 << 24;
  VP8LColorCache* const color_cache =
      (hdr->color_cache_size_ > 0) ? &hdr->color_cache_ : NULL;
  const int mask = hdr->huffman_mask_;
  const HTreeGroup* htree_group =
      (src < src_last) ? GetHtreeGroupForPos(hdr, col, row) : NULL;
  assert(dec->last_row_ < last_row);
  assert(src_last <= src_end);

  while (src < src_last) {
    int code;
    if (row >= next_sync_row) {
      SaveState(dec, (int)(src - data));
      next_sync_row = row + SYNC_EVERY_N_ROWS;
    }
    // Only update when changing tile. Note we could use this test:
    // if "((((prev_col ^ col) | prev_row ^ row)) > mask)" -> tile changed
    // but that's actually slower and needs storing the previous col/row.
    if ((col & mask) == 0) {
      htree_group = GetHtreeGroupForPos(hdr, col, row);
    }
    assert(htree_group != NULL);
    if (htree_group->is_trivial_code) {
      *src = htree_group->literal_arb;
      goto AdvanceByOne;
    }
    VP8LFillBitWindow(br);
    if (htree_group->use_packed_table) {
      code = ReadPackedSymbols(htree_group, br, src);
      if (VP8LIsEndOfStream(br)) break;
      if (code == PACKED_NON_LITERAL_CODE) goto AdvanceByOne;
    } else {
      code = ReadSymbol(htree_group->htrees[GREEN], br);
    }
    if (VP8LIsEndOfStream(br)) break;
    if (code < NUM_LITERAL_CODES) {  // Literal
      if (htree_group->is_trivial_literal) {
        *src = htree_group->literal_arb | (code << 8);
      } else {
        int red, blue, alpha;
        red = ReadSymbol(htree_group->htrees[RED], br);
        VP8LFillBitWindow(br);
        blue = ReadSymbol(htree_group->htrees[BLUE], br);
        alpha = ReadSymbol(htree_group->htrees[ALPHA], br);
        if (VP8LIsEndOfStream(br)) break;
        *src = ((uint32_t)alpha << 24) | (red << 16) | (code << 8) | blue;
      }
    AdvanceByOne:
      ++src;
      ++col;
      if (col >= width) {
        col = 0;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
        if (color_cache != NULL) {
          while (last_cached < src) {
            VP8LColorCacheInsert(color_cache, *last_cached++);
          }
        }
      }
    } else if (code < len_code_limit) {  // Backward reference
      int dist_code, dist;
      const int length_sym = code - NUM_LITERAL_CODES;
      const int length = GetCopyLength(length_sym, br);
      const int dist_symbol = ReadSymbol(htree_group->htrees[DIST], br);
      VP8LFillBitWindow(br);
      dist_code = GetCopyDistance(dist_symbol, br);
      dist = PlaneCodeToDistance(width, dist_code);

      if (VP8LIsEndOfStream(br)) break;
      if (src - data < (ptrdiff_t)dist || src_end - src < (ptrdiff_t)length) {
        goto Error;
      } else {
        CopyBlock32b(src, dist, length);
      }
      src += length;
      col += length;
      while (col >= width) {
        col -= width;
        ++row;
        if (process_func != NULL) {
          if (row <= last_row && (row % NUM_ARGB_CACHE_ROWS == 0)) {
            process_func(dec, row);
          }
        }
      }
      // Because of the check done above (before 'src' was incremented by
      // 'length'), the following holds true.
      assert(src <= src_end);
      if (col & mask) htree_group = GetHtreeGroupForPos(hdr, col, row);
      if (color_cache != NULL) {
        while (last_cached < src) {
          VP8LColorCacheInsert(color_cache, *last_cached++);
        }
      }
    } else if (code < color_cache_limit) {  // Color cache
      const int key = code - len_code_limit;
      assert(color_cache != NULL);
      while (last_cached < src) {
        VP8LColorCacheInsert(color_cache, *last_cached++);
      }
      *src = VP8LColorCacheLookup(color_cache, key);
      goto AdvanceByOne;
    } else {  // Not reached
      goto Error;
    }
  }

  br->eos_ = VP8LIsEndOfStream(br);
  if (dec->incremental_ && br->eos_ && src < src_end) {
    RestoreState(dec);
  } else if (!br->eos_) {
    // Process the remaining rows corresponding to last row-block.
    if (process_func != NULL) {
      process_func(dec, row > last_row ? last_row : row);
    }
    dec->status_ = VP8_STATUS_OK;
    dec->last_pixel_ = (int)(src - data);  // end-of-scan marker
  } else {
    // if not incremental, and we are past the end of buffer (eos_=1), then this
    // is a real bitstream error.
    goto Error;
  }
  return 1;

 Error:
  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  return 0;
}